

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interval_heap.hpp
# Opt level: O0

void boost::heap::interval_heap_internal::
     sift_down<false,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,std::less<int>>
               (int *first,int *last,difference_type origin,long param_4)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  reference piVar4;
  reference piVar5;
  long parent;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_110;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_108;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_100 [4];
  int *local_e0;
  int *local_d8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_d0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_c8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_c0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_b8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_b0;
  undefined1 local_a1;
  long lStack_a0;
  bool swap_required;
  long cochild;
  long child_1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_88;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_80;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_78;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_70;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_68;
  long local_60;
  long child;
  long end_parent;
  long index_end;
  int local_3c;
  difference_type dStack_38;
  Value limbo;
  long index;
  long limit_child_local;
  long origin_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_18;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first_local;
  
  dStack_38 = origin;
  index = param_4;
  limit_child_local = origin;
  local_18._M_current = last;
  last_local._M_current = first;
  index_end = (long)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator+(&last_local,origin);
  piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                     ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                      &index_end);
  local_3c = *piVar4;
  end_parent = __gnu_cxx::operator-(&local_18,&last_local);
  child = end_parent / 2 + -1;
  while (dStack_38 < child) {
    local_60 = dStack_38 * 2 + 1;
    local_70 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator+(&last_local,local_60);
    local_68 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator+(&local_70,0);
    piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_68);
    local_80 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator+(&last_local,local_60);
    local_78 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator+(&local_80,2);
    piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_78);
    bVar3 = std::less<int>::operator()((less<int> *)((long)&origin_local + 7),piVar4,piVar5);
    if (bVar3) {
      local_60 = local_60 + 2;
    }
    local_88 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator+(&last_local,local_60);
    piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_88);
    iVar1 = *piVar4;
    child_1 = (long)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator+(&last_local,dStack_38);
    piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                        &child_1);
    *piVar4 = iVar1;
    dStack_38 = local_60;
  }
  if (dStack_38 <= child + 1) {
    cochild = dStack_38 * 2 + 1;
    if (cochild < end_parent) {
      lStack_a0 = dStack_38 * 2 + 2;
      if (lStack_a0 != end_parent) {
        local_b0 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator+(&last_local,cochild);
        piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&local_b0);
        local_b8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator+(&last_local,lStack_a0);
        piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&local_b8);
        local_a1 = std::less<int>::operator()((less<int> *)((long)&origin_local + 7),piVar4,piVar5);
        if ((bool)local_a1) {
          local_c0 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator+(&last_local,lStack_a0);
          piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_c0);
          iVar1 = *piVar4;
          local_c8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator+(&last_local,dStack_38);
          piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_c8);
          iVar2 = local_3c;
          *piVar4 = iVar1;
          local_d0 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator+(&last_local,lStack_a0);
          piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_d0);
          *piVar4 = iVar2;
          dStack_38 = lStack_a0;
          local_d8 = last_local._M_current;
          local_e0 = local_18._M_current;
          sift_leaf_min<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,std::less<int>>
                    (last_local._M_current,local_18._M_current,lStack_a0,index);
          return;
        }
      }
      local_100[0] = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator+(&last_local,cochild);
      piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(local_100);
      iVar1 = *piVar4;
      local_108 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                  operator+(&last_local,dStack_38);
      piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_108);
      *piVar4 = iVar1;
      dStack_38 = cochild;
    }
  }
  iVar1 = local_3c;
  local_110 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator+(&last_local,dStack_38);
  piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                     (&local_110);
  *piVar4 = iVar1;
  sift_leaf_max<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,std::less<int>>
            (last_local._M_current,local_18._M_current,dStack_38,index);
  return;
}

Assistant:

void sift_down (Iterator first, Iterator last, Offset origin, Compare compare,
                Offset limit_child)
{
//  Use the most specialized available functions.
  using namespace std;

//  By keeping track of where I started, I can roll back all changes.
  Offset index = origin;
#if (__cplusplus >= 201103L)  //  C++11
  typedef typename iterator_traits<Iterator>::value_type Value;
  Value limbo = std::move_if_noexcept(*(first + index));
#endif

  const Offset index_end = last - first;
//  One past the last element with two children.
  const Offset end_parent = index_end / 2 -
                              ((left_bound && ((index_end & 3) == 0)) ? 2 : 1);
  try { //  This try-catch block rolls back after exceptions.
    while (index < end_parent) {
      Offset child = index * 2 + (left_bound ? 2 : 1);
//  If compare throws, heap property cannot be verified or enforced.
      try { //  This try-catch block ensures no element is left in limbo.
        if (compare(*(first + child + (left_bound ? 2 : 0)),
                    *(first + child + (left_bound ? 0 : 2))))
          child += 2;
      } catch (...) {
#if (__cplusplus >= 201103L)  //  C++11
//  Pull the moving element out of limbo, to avoid leaks.
        *(first + index) = std::move_if_noexcept(limbo);
#endif
        throw;  //  Re-throw the current exception.
      }
#if (__cplusplus >= 201103L)  //  C++11
      *(first + index) = std::move_if_noexcept(*(first + child));
#else
      swap(*(first + index), *(first + child));
#endif
      index = child;
    }
//  Special case when index has exactly one child.
    if (index <= end_parent + (left_bound ? 0 : 1)) {
      Offset child = index * 2 + (left_bound ? 2 : 1);
      if (child < index_end) {
        const Offset cochild = child + 1;
//  Need to treat singletons (child + 1) as both upper and lower bounds.
        if (!left_bound && (cochild != index_end)) {
//  Calculating this outside the if-statement simplifies exception-handling.
          bool swap_required;
          try {
            swap_required = compare(*(first + child), *(first + cochild));
          } catch (...) {
//  Pull the moving element out of limbo.
#if (__cplusplus >= 201103L)
            *(first + index) = std::move_if_noexcept(limbo);
#endif
            throw;  //  Re-throw the current exception.
          }
          if (swap_required) {
            //++child;
#if (__cplusplus >= 201103L)  //  C++11
            *(first + index) = std::move_if_noexcept(*(first + cochild));
            *(first + cochild) = std::move_if_noexcept(limbo);
#else
            swap(*(first + index), *(first + cochild));
#endif
            index = cochild;  //  Important for the rollback.
            sift_leaf_min<Iterator, Offset, Compare>(first, last, index,
                                                     compare, limit_child);
            return;
          }
        }
#if (__cplusplus >= 201103L)  //  C++11
        *(first + index) = std::move_if_noexcept(*(first + child));
#else
        swap(*(first + index), *(first + child));
#endif
        index = child;
      }
    }
//  Pull the moving element out of limbo.
#if (__cplusplus >= 201103L)  //  C++11
    *(first + index) = std::move_if_noexcept(limbo);
#endif
    if (left_bound)
      sift_leaf_min<Iterator, Offset, Compare>(first, last, index, compare,
                                               limit_child);
    else
      sift_leaf_max<Iterator, Offset, Compare>(first, last, index, compare,
                                               limit_child);
  } catch (...) {
//  Rolls back comparison exceptions. Move exceptions can't be reliably fixed.
    while (index > origin) {
      const Offset parent = ((index / 2 - 1) | 1) ^ (left_bound ? 1 : 0);
      swap(*(first + parent), *(first + index));
      index = parent;
    }
    throw;  //  Re-throw the current exception.
  }
}